

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

property_ptr __thiscall
dtc::fdt::property::parse_dtb(property *this,input_buffer *structs,input_buffer *strings)

{
  property *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  property_ptr pVar2;
  __shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = (property *)operator_new(0x78);
  property(this_00,structs,strings);
  std::__shared_ptr<dtc::fdt::property,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<dtc::fdt::property,void>
            ((__shared_ptr<dtc::fdt::property,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  _Var1._M_pi = extraout_RDX;
  if ((this->key)._M_dataplus._M_p[0x70] == '\0') {
    local_38._M_ptr = (element_type *)0x0;
    local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> *)this,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    _Var1._M_pi = extraout_RDX_00;
  }
  pVar2.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  pVar2.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (property_ptr)pVar2.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

property_ptr
property::parse_dtb(input_buffer &structs, input_buffer &strings)
{
	property_ptr p(new property(structs, strings));
	if (!p->valid)
	{
		p = nullptr;
	}
	return p;
}